

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O2

bool __thiscall QFSFileEnginePrivate::seekFdFh(QFSFileEnginePrivate *this,qint64 pos)

{
  QAbstractFileEngine *this_00;
  int iVar1;
  int *piVar2;
  __off64_t _Var3;
  bool bVar4;
  long in_FS_OFFSET;
  QMessageLogger local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QAbstractFileEnginePrivate).q_ptr;
  if (this->lastIOCommand == IOFlushCommand) {
    if (-1 < pos) goto LAB_00228acf;
  }
  else {
    iVar1 = (*this_00->_vptr_QAbstractFileEngine[4])(this_00);
    bVar4 = false;
    if ((pos < 0) || ((char)iVar1 == '\0')) goto LAB_00228ba2;
LAB_00228acf:
    if (this->fh == (FILE *)0x0) {
      _Var3 = lseek64(this->fd,pos,0);
      bVar4 = true;
      if (_Var3 == -1) {
        piVar2 = __errno_location();
        QSystemError::stdString((QString *)&local_48,*piVar2);
        QAbstractFileEngine::setError(this_00,PositionError,(QString *)&local_48);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
        local_48.context.version = 2;
        local_48.context.function._4_4_ = 0;
        local_48.context._4_8_ = 0;
        local_48.context._12_8_ = 0;
        local_48.context.category = "default";
        bVar4 = false;
        QMessageLogger::warning(&local_48,"QFile::at: Cannot set file position %lld",pos);
      }
      goto LAB_00228ba2;
    }
    do {
      iVar1 = fseeko64((FILE *)this->fh,pos,0);
      if (iVar1 == 0) {
        bVar4 = true;
        goto LAB_00228ba2;
      }
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
    QSystemError::stdString((QString *)&local_48,*piVar2);
    QAbstractFileEngine::setError(this_00,ReadError,(QString *)&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
  }
  bVar4 = false;
LAB_00228ba2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QFSFileEnginePrivate::seekFdFh(qint64 pos)
{
    Q_Q(QFSFileEngine);

    // On Windows' stdlib implementation, the results of calling fread and
    // fwrite are undefined if not called either in sequence, or if preceded
    // with a call to fflush().
    if (lastIOCommand != QFSFileEnginePrivate::IOFlushCommand && !q->flush())
        return false;

    if (pos < 0 || pos != qint64(QT_OFF_T(pos)))
        return false;

    if (fh) {
        // Buffered stdlib mode.
        int ret;
        do {
            ret = QT_FSEEK(fh, QT_OFF_T(pos), SEEK_SET);
        } while (ret != 0 && errno == EINTR);

        if (ret != 0) {
            q->setError(QFile::ReadError, QSystemError::stdString(errno));
            return false;
        }
    } else {
        // Unbuffered stdio mode.
        if (QT_LSEEK(fd, QT_OFF_T(pos), SEEK_SET) == -1) {
            q->setError(QFile::PositionError, QSystemError::stdString(errno));
            qWarning("QFile::at: Cannot set file position %lld", pos);
            return false;
        }
    }
    return true;
}